

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

void __thiscall capnp::MembraneHook::~MembraneHook(MembraneHook *this)

{
  if (this->revoked == false) {
    removeFromMap(this);
  }
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->revocationTask);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&(this->resolved).ptr);
  kj::Own<capnp::MembranePolicy,_std::nullptr_t>::dispose(&this->policy);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&this->inner);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~MembraneHook() noexcept(false) {
    if (!revoked) {
      removeFromMap();
    }
  }